

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall Catch::XmlEncode::XmlEncode(XmlEncode *this,string *str,ForWhat forWhat)

{
  pointer pcVar1;
  
  (this->m_str)._M_dataplus._M_p = (pointer)&(this->m_str).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + str->_M_string_length);
  this->m_forWhat = forWhat;
  return;
}

Assistant:

XmlEncode::XmlEncode( std::string const& str, ForWhat forWhat )
    :   m_str( str ),
        m_forWhat( forWhat )
    {}